

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O2

DirectionCone * RandomCone(DirectionCone *__return_storage_ptr__,RNG *rng)

{
  undefined1 auVar1 [16];
  float fVar2;
  undefined1 auVar3 [64];
  Vector3f w;
  Point2f local_18;
  undefined1 extraout_var [60];
  
  fVar2 = pbrt::RNG::Uniform<float>(rng);
  local_18.super_Tuple2<pbrt::Point2,_float>.y = pbrt::RNG::Uniform<float>(rng);
  local_18.super_Tuple2<pbrt::Point2,_float>.x = fVar2;
  w = pbrt::SampleUniformSphere(&local_18);
  auVar3._0_4_ = pbrt::RNG::Uniform<float>(rng);
  auVar3._4_60_ = extraout_var;
  auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),auVar3._0_16_,ZEXT416(0xbf800000));
  pbrt::DirectionCone::DirectionCone(__return_storage_ptr__,w,auVar1._0_4_);
  return __return_storage_ptr__;
}

Assistant:

DirectionCone RandomCone(RNG &rng) {
    Vector3f w = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
    return DirectionCone(w, -1 + 2 * rng.Uniform<Float>());
}